

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  ulong uVar1;
  undefined8 in_RAX;
  long lVar2;
  int iVar3;
  double x;
  undefined1 auVar4 [16];
  double y;
  undefined1 auVar5 [16];
  int width;
  undefined8 local_28;
  char cVar6;
  
  if (_glfwInitialized == '\0') {
    iVar3 = 0x10001;
LAB_0010d7dc:
    _glfwInputError(iVar3,(char *)0x0);
    return;
  }
  if (mode == 0x33003) {
    if (handle[0x39] == (GLFWwindow)(value != 0)) {
      return;
    }
    if (value == 0) {
      uVar1 = *(ulong *)(handle + 0x54);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar1;
      if ((char)uVar1 == '\x03') {
        handle[0x54] = (GLFWwindow)0x0;
      }
      auVar5[1] = -((char)uVar1 == '\0');
      auVar5[0] = 0xff;
      auVar5[2] = -((char)(uVar1 >> 8) == '\x03');
      auVar5[3] = -((char)(uVar1 >> 0x10) == '\x03');
      auVar5[4] = 0xff;
      cVar6 = (char)(uVar1 >> 0x20);
      auVar5[5] = -(cVar6 == '\0');
      auVar5[6] = -((char)(uVar1 >> 0x28) == '\0');
      auVar5[7] = -((char)(uVar1 >> 0x30) == '\0');
      auVar5[8] = 0xff;
      auVar5[9] = 0xff;
      auVar5[10] = 0xff;
      auVar5[0xb] = 0xff;
      auVar5[0xc] = 0xff;
      auVar5[0xd] = 0xff;
      auVar5[0xe] = 0xff;
      auVar5[0xf] = 0xff;
      if ((auVar5[2] & 1) != 0) {
        handle[0x55] = (GLFWwindow)0x0;
      }
      auVar4 = pshuflw(auVar5,auVar4,0x55);
      if (auVar4[4] == '\x03') {
        handle[0x56] = (GLFWwindow)0x0;
      }
      if ((char)(uVar1 >> 0x18) == '\x03') {
        handle[0x57] = (GLFWwindow)0x0;
      }
      if (cVar6 == '\0') {
        handle[0x58] = (GLFWwindow)0x0;
      }
      handle[0x59] = (GLFWwindow)0x0;
      handle[0x5a] = (GLFWwindow)0x0;
      handle[0x5b] = (GLFWwindow)0x0;
    }
    handle[0x39] = (GLFWwindow)(value != 0);
    return;
  }
  if (mode == 0x33002) {
    if (handle[0x38] == (GLFWwindow)(value != 0)) {
      return;
    }
    if (value == 0) {
      lVar2 = 0x5c;
      do {
        if (handle[lVar2] == (GLFWwindow)0x3) {
          handle[lVar2] = (GLFWwindow)0x0;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x1b9);
    }
    handle[0x38] = (GLFWwindow)(value != 0);
    return;
  }
  if ((mode != 0x33001) || (value - 0x34004U < 0xfffffffd)) {
    iVar3 = 0x10003;
    goto LAB_0010d7dc;
  }
  iVar3 = *(int *)(handle + 0x50);
  if (iVar3 == value) {
    return;
  }
  *(int *)(handle + 0x50) = value;
  y = _glfw.cursorPosY;
  x = _glfw.cursorPosX;
  if (_glfw.focusedWindow != (_GLFWwindow *)handle) {
    return;
  }
  if (iVar3 == 0x34003) {
    *(double *)(handle + 0x40) = _glfw.cursorPosX;
    *(double *)(handle + 0x48) = y;
  }
  else {
    if (value != 0x34003) goto LAB_0010d9f2;
    _glfw.cursorPosX = *(double *)(handle + 0x40);
    _glfw.cursorPosY = *(double *)(handle + 0x48);
    local_28 = in_RAX;
    _glfwPlatformGetWindowSize((_GLFWwindow *)handle,(int *)((long)&local_28 + 4),(int *)&local_28);
    x = (double)local_28._4_4_ * 0.5;
    y = (double)(int)local_28 * 0.5;
  }
  _glfwPlatformSetCursorPos((_GLFWwindow *)handle,x,y);
LAB_0010d9f2:
  _glfwPlatformSetCursorMode((_GLFWwindow *)handle,value);
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    _GLFW_REQUIRE_INIT();

    switch (mode)
    {
        case GLFW_CURSOR:
            setCursorMode(window, value);
            break;
        case GLFW_STICKY_KEYS:
            setStickyKeys(window, value ? GL_TRUE : GL_FALSE);
            break;
        case GLFW_STICKY_MOUSE_BUTTONS:
            setStickyMouseButtons(window, value ? GL_TRUE : GL_FALSE);
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, NULL);
            break;
    }
}